

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::AddCrossing
          (CrossingProcessor *this,SourceEdgeCrossing *crossing)

{
  pointer *pppVar1;
  undefined4 uVar2;
  iterator __position;
  pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_> local_10;
  
  local_10.first =
       *(int *)&(this->input_dimensions_->
                super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
       *(int *)&(this->input_dimensions_->
                super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_10.second._4_8_ = *(undefined8 *)&(crossing->first).edge_id_;
  uVar2 = *(undefined4 *)&crossing->first;
  local_10.second.first._0_4_ = uVar2;
  __position._M_current =
       (this->source_edge_crossings_).
       super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->source_edge_crossings_).
      super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>,std::allocator<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>>>
    ::_M_realloc_insert<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>>
              ((vector<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>,std::allocator<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>>>
                *)&this->source_edge_crossings_,__position,&local_10);
  }
  else {
    (__position._M_current)->first = local_10.first;
    *(undefined4 *)&((__position._M_current)->second).first.field_0x0 = uVar2;
    *(undefined8 *)&((__position._M_current)->second).first.edge_id_ = local_10.second._4_8_;
    pppVar1 = &(this->source_edge_crossings_).
               super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void AddCrossing(const SourceEdgeCrossing& crossing) {
    source_edge_crossings_.push_back(make_pair(input_edge_id(), crossing));
  }